

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseAttrib(Parser *this,AttributeSelector *attr)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  ValueMatchType VVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  skipSpace(this);
  bVar4 = next(this,IDENT);
  if (bVar4) {
    lexem((QString *)&local_48,this);
    pDVar2 = (attr->name).d.d;
    pcVar3 = (attr->name).d.ptr;
    (attr->name).d.d = local_48.d;
    (attr->name).d.ptr = local_48.ptr;
    qVar1 = (attr->name).d.size;
    (attr->name).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    skipSpace(this);
    bVar4 = test(this,EQUAL);
    if (bVar4) {
      VVar5 = MatchEqual;
LAB_00547104:
      attr->valueMatchCriterium = VVar5;
      skipSpace(this);
      bVar4 = test(this,IDENT);
      if ((!bVar4) && (bVar4 = test(this,STRING), !bVar4)) goto LAB_0054717b;
      unquotedLexem((QString *)&local_48,this);
      pDVar2 = (attr->value).d.d;
      pcVar3 = (attr->value).d.ptr;
      (attr->value).d.d = local_48.d;
      (attr->value).d.ptr = local_48.ptr;
      qVar1 = (attr->value).d.size;
      (attr->value).d.size = local_48.size;
      local_48.d = pDVar2;
      local_48.ptr = pcVar3;
      local_48.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      skipSpace(this);
    }
    else {
      bVar4 = test(this,INCLUDES);
      if (bVar4) {
        VVar5 = MatchIncludes;
        goto LAB_00547104;
      }
      bVar4 = test(this,DASHMATCH);
      if (bVar4) {
        VVar5 = MatchDashMatch;
        goto LAB_00547104;
      }
      bVar4 = test(this,BEGINSWITH);
      VVar5 = MatchBeginsWith;
      if (((bVar4) || (bVar4 = test(this,ENDSWITH), VVar5 = MatchEndsWith, bVar4)) ||
         (bVar4 = test(this,CONTAINS), VVar5 = MatchContains, bVar4)) goto LAB_00547104;
    }
    bVar4 = next(this,RBRACKET);
  }
  else {
LAB_0054717b:
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool Parser::parseAttrib(AttributeSelector *attr)
{
    skipSpace();
    if (!next(IDENT)) return false;
    attr->name = lexem();
    skipSpace();

    if (test(EQUAL)) {
        attr->valueMatchCriterium = AttributeSelector::MatchEqual;
    } else if (test(INCLUDES)) {
        attr->valueMatchCriterium = AttributeSelector::MatchIncludes;
    } else if (test(DASHMATCH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchDashMatch;
    } else if (test(BEGINSWITH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchBeginsWith;
    } else if (test(ENDSWITH)) {
        attr->valueMatchCriterium = AttributeSelector::MatchEndsWith;
    } else if (test(CONTAINS)) {
        attr->valueMatchCriterium = AttributeSelector::MatchContains;
    } else {
        return next(RBRACKET);
    }

    skipSpace();

    if (!test(IDENT) && !test(STRING)) return false;
    attr->value = unquotedLexem();

    skipSpace();
    return next(RBRACKET);
}